

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O1

char * getoffset(char *strp,int_fast32_t *offsetp)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  
  cVar1 = *strp;
  pbVar6 = (byte *)(strp + ((cVar1 - 0x2bU & 0xfd) == 0));
  bVar2 = *pbVar6;
  uVar4 = bVar2 - 0x30;
  pbVar3 = (byte *)0x0;
  if (uVar4 < 10) {
    uVar4 = 0;
    do {
      uVar4 = ((int)(char)bVar2 + uVar4 * 10) - 0x30;
      if (0xa7 < (int)uVar4) goto LAB_00104c65;
      bVar2 = pbVar6[1];
      pbVar6 = pbVar6 + 1;
    } while (bVar2 - 0x30 < 10);
    pbVar3 = pbVar6;
    if ((int)uVar4 < 0) {
      pbVar3 = (byte *)0x0;
    }
  }
LAB_00104c65:
  if (pbVar3 != (byte *)0x0) {
    *offsetp = uVar4 * 0xe10;
    if (*pbVar3 != 0x3a) goto LAB_00104d41;
    bVar2 = pbVar3[1];
    if (bVar2 - 0x30 < 10) {
      pbVar3 = pbVar3 + 1;
      uVar7 = 0;
      do {
        uVar7 = ((int)(char)bVar2 + uVar7 * 10) - 0x30;
        if (0x3b < (int)uVar7) goto LAB_00104cce;
        bVar2 = pbVar3[1];
        pbVar3 = pbVar3 + 1;
      } while (bVar2 - 0x30 < 10);
      if ((int)uVar7 < 0) {
        pbVar3 = (byte *)0x0;
        uVar7 = uVar4;
      }
    }
    else {
LAB_00104cce:
      pbVar3 = (byte *)0x0;
      uVar7 = uVar4;
    }
    if (pbVar3 != (byte *)0x0) {
      iVar5 = uVar7 * 0x3c + uVar4 * 0xe10;
      *offsetp = iVar5;
      if (*pbVar3 != 0x3a) goto LAB_00104d41;
      bVar2 = pbVar3[1];
      if (bVar2 - 0x30 < 10) {
        pbVar3 = pbVar3 + 1;
        uVar4 = 0;
        do {
          uVar4 = ((int)(char)bVar2 + uVar4 * 10) - 0x30;
          if (0x3c < (int)uVar4) goto LAB_00104d32;
          bVar2 = pbVar3[1];
          pbVar3 = pbVar3 + 1;
        } while (bVar2 - 0x30 < 10);
        if ((int)uVar4 < 0) {
          pbVar3 = (byte *)0x0;
          uVar4 = uVar7;
        }
      }
      else {
LAB_00104d32:
        pbVar3 = (byte *)0x0;
        uVar4 = uVar7;
      }
      if (pbVar3 != (byte *)0x0) {
        *offsetp = uVar4 + iVar5;
        goto LAB_00104d41;
      }
    }
  }
  pbVar3 = (byte *)0x0;
LAB_00104d41:
  if ((cVar1 == '-') && (pbVar3 != (byte *)0x0)) {
    *offsetp = -*offsetp;
  }
  return (char *)pbVar3;
}

Assistant:

static const char * getoffset( const char * strp, int_fast32_t * offsetp )
{
    bool neg = false;

    if ( *strp == '-' )
    {
        neg = true;
        ++strp;
    }
    else if ( *strp == '+' )
    {
        ++strp;
    }

    strp = getsecs( strp, offsetp );

    if ( strp == NULL )
    {
        return NULL;        /* illegal time */
    }

    if ( neg )
    {
        *offsetp = - *offsetp;
    }

    return strp;
}